

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(ImGuiID id)

{
  int iVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiPopupRef *pIVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  long lVar8;
  ImGuiPopupRef *pIVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  pIVar7 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  lVar8 = (long)(pIVar3->IDStack).Size;
  if (0 < lVar8) {
    iVar10 = (GImGui->CurrentPopupStack).Size;
    iVar1 = GImGui->FrameCount;
    uVar2 = (pIVar3->IDStack).Data[lVar8 + -1];
    IVar4 = (GImGui->IO).MousePos;
    IVar6 = NavCalcPreferredRefPos();
    iVar11 = (pIVar7->OpenPopupStack).Size;
    if (iVar10 < iVar11) {
      iVar12 = iVar10 + 1;
      iVar11 = (pIVar7->OpenPopupStack).Capacity;
      if (iVar10 < iVar11) {
        pIVar9 = (pIVar7->OpenPopupStack).Data;
      }
      else {
        if (iVar11 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar11 / 2 + iVar11;
        }
        if (iVar11 <= iVar12) {
          iVar11 = iVar12;
        }
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pIVar9 = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)((long)iVar11 * 0x30,GImAllocatorUserData)
        ;
        pIVar5 = (pIVar7->OpenPopupStack).Data;
        if (pIVar5 != (ImGuiPopupRef *)0x0) {
          memcpy(pIVar9,pIVar5,(long)(pIVar7->OpenPopupStack).Size * 0x30);
          pIVar5 = (pIVar7->OpenPopupStack).Data;
          if (pIVar5 != (ImGuiPopupRef *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
        (pIVar7->OpenPopupStack).Data = pIVar9;
        (pIVar7->OpenPopupStack).Capacity = iVar11;
      }
      (pIVar7->OpenPopupStack).Size = iVar12;
      pIVar5 = pIVar9 + iVar10;
      if ((pIVar9[iVar10].PopupId == id) && (pIVar5->OpenFrameCount == pIVar7->FrameCount + -1)) {
        pIVar5->OpenFrameCount = iVar1;
      }
      else {
        pIVar5->PopupId = id;
        pIVar5->Window = (ImGuiWindow *)0x0;
        pIVar5->ParentWindow = pIVar3;
        pIVar5->OpenFrameCount = iVar1;
        pIVar5->OpenParentId = uVar2;
        pIVar5->OpenPopupPos = IVar6;
        pIVar5->OpenMousePos = IVar4;
      }
    }
    else {
      if (iVar11 == (pIVar7->OpenPopupStack).Capacity) {
        if (iVar11 == 0) {
          iVar10 = 8;
        }
        else {
          iVar10 = iVar11 / 2 + iVar11;
        }
        iVar12 = iVar11 + 1;
        if (iVar11 + 1 < iVar10) {
          iVar12 = iVar10;
        }
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pIVar9 = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)((long)iVar12 * 0x30,GImAllocatorUserData)
        ;
        pIVar5 = (pIVar7->OpenPopupStack).Data;
        if (pIVar5 != (ImGuiPopupRef *)0x0) {
          memcpy(pIVar9,pIVar5,(long)(pIVar7->OpenPopupStack).Size * 0x30);
          pIVar5 = (pIVar7->OpenPopupStack).Data;
          if (pIVar5 != (ImGuiPopupRef *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
        (pIVar7->OpenPopupStack).Data = pIVar9;
        (pIVar7->OpenPopupStack).Capacity = iVar12;
        iVar11 = (pIVar7->OpenPopupStack).Size;
      }
      else {
        pIVar9 = (pIVar7->OpenPopupStack).Data;
      }
      pIVar9[iVar11].PopupId = id;
      pIVar9[iVar11].Window = (ImGuiWindow *)0x0;
      pIVar9[iVar11].ParentWindow = pIVar3;
      pIVar9[iVar11].OpenFrameCount = iVar1;
      pIVar9[iVar11].OpenParentId = uVar2;
      pIVar9[iVar11].OpenPopupPos = IVar6;
      pIVar9[iVar11].OpenMousePos = IVar4;
      (pIVar7->OpenPopupStack).Size = (pIVar7->OpenPopupStack).Size + 1;
    }
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4ca,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.CurrentPopupStack.Size;
    ImGuiPopupRef popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.ParentWindow = parent_window;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenMousePos = g.IO.MousePos;
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();

    //printf("[%05d] OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Close child popups if any
        g.OpenPopupStack.resize(current_stack_size + 1);

        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        else
            g.OpenPopupStack[current_stack_size] = popup_ref;

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}